

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O1

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsGL
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  pointer *ppPVar1;
  uint uVar2;
  SerializedResourceSignatureImpl *this;
  iterator __position;
  Uint32 i;
  BINDING_RANGE BVar3;
  PipelineResourceSignatureDesc *pPVar4;
  PipelineResourceSignatureGLImpl *pPVar5;
  PipelineResourceDesc *Desc;
  PipelineResourceAttribsType *pPVar6;
  long lVar7;
  SHADER_TYPE SVar8;
  char (*in_RCX) [19];
  SHADER_TYPE SVar9;
  Uint32 ResIndex;
  ulong uVar10;
  char (*in_R8) [3];
  uint uVar11;
  SHADER_TYPE Stages;
  Uint8 *Args;
  bool bVar12;
  string msg;
  TBindings BaseBindings;
  undefined1 local_b8 [32];
  IPipelineResourceSignature **local_98;
  ushort local_90 [4];
  ulong local_88;
  ulong local_80;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> local_78 [9];
  
  SVar9 = Info->ShaderStages;
  local_78[6].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[7].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[4].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[5].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[2].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[3].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[0].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[1].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  uVar2 = Info->ResourceSignaturesCount;
  if ((ulong)uVar2 == 0) {
    uVar11 = 0;
  }
  else {
    local_98 = Info->ppResourceSignatures;
    uVar11 = 0;
    uVar10 = 0;
    do {
      this = (SerializedResourceSignatureImpl *)local_98[uVar10];
      if (this == (SerializedResourceSignatureImpl *)0x0) {
        FormatString<char[26],char[19]>
                  ((string *)local_b8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pSerPRS != nullptr",in_RCX);
        DebugAssertionFailed
                  ((Char *)local_b8._0_8_,"SortResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                   ,0x38);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
      }
      else {
        CheckDynamicType<Diligent::SerializedResourceSignatureImpl,Diligent::IPipelineResourceSignature>
                  ((IPipelineResourceSignature *)this);
      }
      pPVar4 = SerializedResourceSignatureImpl::GetDesc(this);
      Args = &pPVar4->BindingIndex;
      if (local_78[pPVar4->BindingIndex].m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
        FormatString<char[49],unsigned_char,char[3]>
                  ((string *)local_b8,(Diligent *)"Multiple signatures use the same binding index ("
                   ,(char (*) [49])Args,").",in_R8);
        DebugAssertionFailed
                  ((Char *)local_b8._0_8_,"SortResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                   ,0x3c);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
      }
      pPVar5 = SerializedResourceSignatureImpl::
               GetDeviceSignature<Diligent::PipelineResourceSignatureGLImpl>(this,OpenGL);
      in_RCX = (char (*) [19])(ulong)*Args;
      RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator=
                (local_78 + (long)in_RCX,pPVar5);
      if (uVar11 <= *Args + 1) {
        uVar11 = *Args + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  local_90[0] = 0;
  local_90[1] = 0;
  local_90[2] = 0;
  local_90[3] = 0;
  if (uVar11 != 0) {
    SVar8 = SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS;
    if (SVar9 != SHADER_TYPE_UNKNOWN) {
      SVar8 = SVar9 & (SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS);
    }
    local_88 = (ulong)uVar11;
    uVar10 = 0;
    do {
      if (local_78[uVar10].m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
        pPVar5 = local_78[uVar10].m_pObject;
        if ((pPVar5->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.NumResources != 0) {
          ResIndex = 0;
          local_80 = uVar10;
          do {
            uVar10 = local_80;
            Desc = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                             (&pPVar5->
                               super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                              ResIndex);
            pPVar6 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                               (&(local_78[uVar10].m_pObject)->
                                 super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                                ResIndex);
            BVar3 = PipelineResourceToBindingRange(Desc);
            local_98 = (IPipelineResourceSignature **)CONCAT44(local_98._4_4_,ResIndex);
            if (SVar8 != SHADER_TYPE_UNKNOWN) {
              SVar9 = SVar8;
              do {
                Stages = -SVar9 & SVar9;
                if ((Desc->ShaderStages & Stages) != SHADER_TYPE_UNKNOWN) {
                  ResDescToPipelineResBinding
                            ((PipelineResourceBinding *)local_b8,Desc,Stages,
                             (uint)local_90[BVar3] + pPVar6->CacheOffset,0);
                  __position._M_current =
                       (ResourceBindings->
                       super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (ResourceBindings->
                      super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                    ::_M_realloc_insert<Diligent::PipelineResourceBinding>
                              (ResourceBindings,__position,(PipelineResourceBinding *)local_b8);
                  }
                  else {
                    (__position._M_current)->Space = local_b8._16_2_;
                    *(undefined2 *)&(__position._M_current)->field_0x12 = local_b8._18_2_;
                    (__position._M_current)->Register = local_b8._20_4_;
                    *(undefined8 *)&(__position._M_current)->ArraySize = local_b8._24_8_;
                    (__position._M_current)->Name = (Char *)local_b8._0_8_;
                    (__position._M_current)->ResourceType = local_b8[8];
                    *(undefined3 *)&(__position._M_current)->field_0x9 = local_b8._9_3_;
                    (__position._M_current)->ShaderStages = local_b8._12_4_;
                    ppPVar1 = &(ResourceBindings->
                               super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppPVar1 = *ppPVar1 + 1;
                  }
                }
                bVar12 = Stages != SVar9;
                SVar9 = Stages ^ SVar9;
              } while (bVar12);
            }
            ResIndex = (int)local_98 + 1;
            pPVar5 = local_78[local_80].m_pObject;
            uVar10 = local_80;
          } while (ResIndex <
                   (pPVar5->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                   .m_Desc.NumResources);
        }
        lVar7 = 0;
        do {
          local_90[lVar7] =
               local_90[lVar7] +
               *(short *)((long)(&(pPVar5->
                                  super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>)
                                  .m_StaticResStageIndex + 5) + lVar7 * 2 + 3);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_88);
  }
  lVar7 = 0x38;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)
               ((long)&local_78[0].m_pObject + lVar7));
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsGL(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto            ShaderStages        = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);
    constexpr SHADER_TYPE SupportedStagesMask = (SHADER_TYPE_ALL_GRAPHICS | SHADER_TYPE_COMPUTE);

    SignatureArray<PipelineResourceSignatureGLImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    PipelineResourceSignatureGLImpl::TBindings BaseBindings = {};
    for (Uint32 s = 0; s < SignaturesCount; ++s)
    {
        const auto& pSignature = Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            const auto  Range   = PipelineResourceToBindingRange(ResDesc);

            for (auto Stages = ShaderStages & SupportedStagesMask; Stages != 0;)
            {
                const auto ShaderStage = ExtractLSB(Stages);
                if ((ResDesc.ShaderStages & ShaderStage) == 0)
                    continue;

                ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ShaderStage, BaseBindings[Range] + ResAttr.CacheOffset, 0 /*space*/));
            }
        }
        pSignature->ShiftBindings(BaseBindings);
    }
}